

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::exe(void)

{
  ulong uVar1;
  ErrnoError *this;
  int *piVar2;
  Path *in_RDI;
  allocator local_1071;
  string local_1070 [32];
  Pathie local_1050 [48];
  ulong local_1020;
  ssize_t size;
  char buf [4096];
  
  uVar1 = ::readlink("/proc/self/exe",(char *)&size,0x1000);
  local_1020 = uVar1;
  if ((long)uVar1 < 0) {
    this = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this,*piVar2);
    __cxa_throw(this,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1070,(char *)&size,uVar1,&local_1071);
  filename_to_utf8(local_1050,(string *)local_1070);
  Path(in_RDI,(string *)local_1050);
  std::__cxx11::string::~string((string *)local_1050);
  std::__cxx11::string::~string(local_1070);
  std::allocator<char>::~allocator((allocator<char> *)&local_1071);
  return in_RDI;
}

Assistant:

Path Path::exe()
{
#if defined(__linux__)
  char buf[PATH_MAX];
  ssize_t size = ::readlink("/proc/self/exe", buf, PATH_MAX);

  if (size < 0)
    throw(Pathie::ErrnoError(errno));

  return Path(filename_to_utf8(std::string(buf, size)));
#elif defined(__APPLE__)
  char buf[PATH_MAX];
  uint32_t size = sizeof(buf);

  if (_NSGetExecutablePath(buf, &size) == 0)
    // Might contain symlinks or extra slashes. Shouldn't be an issue though
    // https://stackoverflow.com/questions/799679/programmatically-retrieving-the-absolute-path-of-an-os-x-command-line-app/1024933#1024933
    return Path(filename_to_utf8(std::string(buf, size)));
  else
    throw(Pathie::ErrnoError(errno));
#elif defined(BSD)
  // BSD does not have /proc mounted by default. However, using raw syscalls,
  // we can figure out what would have been in /proc/curproc/file. See
  // sysctl(3) for the management info base identifiers that are used here.
  int mib[4];
  char buf[PATH_MAX];
  size_t bufsize = PATH_MAX;
  mib[0] = CTL_KERN;
  mib[1] = KERN_PROC;
  mib[2] = KERN_PROC_PATHNAME;
  mib[3] = -1; // According to sysctl(3), -1 means the current process.

  if (sysctl(mib, 4, buf, &bufsize, NULL, 0) != 0) // Note this changes `bufsize' to the number of chars copied
    throw(Pathie::ErrnoError(errno));

  return Path(filename_to_utf8(std::string(buf, bufsize - 1))); // Exclude terminating NUL
#elif defined(_WIN32)
  wchar_t buf[MAX_PATH];
  if (GetModuleFileNameW(NULL, buf, MAX_PATH) == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

  std::string str = utf16_to_utf8(buf);
  return Path(str);
#else
#error Unsupported platform.
#endif
}